

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O2

bool __thiscall cmExportFileGenerator::GenerateImportFile(cmExportFileGenerator *this)

{
  int iVar1;
  cmGeneratedFileStream *this_00;
  ostream *poVar2;
  undefined4 extraout_var;
  undefined1 uVar3;
  openmode openmodeApp;
  stringstream mainFileBuffer;
  undefined1 local_320 [8];
  streambuf local_318 [368];
  stringstream mainFileWithHeadersAndFootersBuffer;
  undefined1 local_198 [8];
  streambuf local_190 [368];
  
  if (this->AppendMode == true) {
    openmodeApp = _S_app;
    _mainFileBuffer = (this->MainImportFile)._M_dataplus._M_p;
    std::make_unique<std::ofstream,char_const*,std::_Ios_Openmode&>
              ((char **)&mainFileWithHeadersAndFootersBuffer,(_Ios_Openmode *)&mainFileBuffer);
    this_00 = _mainFileWithHeadersAndFootersBuffer;
    if (_mainFileWithHeadersAndFootersBuffer != (cmGeneratedFileStream *)0x0) goto LAB_0038ba3d;
    this_00 = (cmGeneratedFileStream *)0x0;
  }
  else {
    this_00 = (cmGeneratedFileStream *)operator_new(0x268);
    cmGeneratedFileStream::cmGeneratedFileStream(this_00,&this->MainImportFile,true,None);
    cmGeneratedFileStream::SetCopyIfDifferent(this_00,true);
LAB_0038ba3d:
    if (((&(this_00->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.field_0x20)
         [(long)(this_00->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.
                _vptr_basic_ostream[-3]] & 5) == 0) {
      std::__cxx11::stringstream::stringstream((stringstream *)&mainFileWithHeadersAndFootersBuffer)
      ;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&mainFileBuffer,"",(allocator<char> *)&openmodeApp);
      (*this->_vptr_cmExportFileGenerator[4])(this,local_198,&mainFileBuffer);
      std::__cxx11::string::~string((string *)&mainFileBuffer);
      std::__cxx11::stringstream::stringstream((stringstream *)&mainFileBuffer);
      iVar1 = (*this->_vptr_cmExportFileGenerator[0xd])(this,local_320);
      uVar3 = (undefined1)iVar1;
      if (((this->AppendMode == false) &&
          (iVar1 = (*this->_vptr_cmExportFileGenerator[0x13])(this),
          CONCAT44(extraout_var,iVar1) != 0)) && (this->ExportPackageDependencies == true)) {
        SetRequiredCMakeVersion(this,3,9,0);
        (*this->_vptr_cmExportFileGenerator[0xb])(this,local_198);
      }
      std::ostream::operator<<(local_198,local_318);
      (*this->_vptr_cmExportFileGenerator[5])(this,local_198);
      (*this->_vptr_cmExportFileGenerator[3])(this,local_198);
      (*this->_vptr_cmExportFileGenerator[2])(this,this_00);
      std::ostream::operator<<(this_00,local_190);
      std::__cxx11::stringstream::~stringstream((stringstream *)&mainFileBuffer);
      std::__cxx11::stringstream::~stringstream
                ((stringstream *)&mainFileWithHeadersAndFootersBuffer);
      goto LAB_0038bbeb;
    }
  }
  cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&mainFileWithHeadersAndFootersBuffer);
  poVar2 = std::operator<<((ostream *)&mainFileWithHeadersAndFootersBuffer,"cannot write to file \""
                          );
  poVar2 = std::operator<<(poVar2,(string *)&this->MainImportFile);
  poVar2 = std::operator<<(poVar2,"\": ");
  std::operator<<(poVar2,(string *)&mainFileBuffer);
  std::__cxx11::stringbuf::str();
  cmSystemTools::Error((string *)&openmodeApp);
  std::__cxx11::string::~string((string *)&openmodeApp);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&mainFileWithHeadersAndFootersBuffer)
  ;
  std::__cxx11::string::~string((string *)&mainFileBuffer);
  uVar3 = 0;
  if (this_00 == (cmGeneratedFileStream *)0x0) {
    return false;
  }
LAB_0038bbeb:
  (*(this_00->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
    [1])(this_00);
  return (bool)uVar3;
}

Assistant:

bool cmExportFileGenerator::GenerateImportFile()
{
  // Open the output file to generate it.
  std::unique_ptr<cmsys::ofstream> foutPtr;
  if (this->AppendMode) {
    // Open for append.
    auto openmodeApp = std::ios::app;
    foutPtr = cm::make_unique<cmsys::ofstream>(this->MainImportFile.c_str(),
                                               openmodeApp);
  } else {
    // Generate atomically and with copy-if-different.
    std::unique_ptr<cmGeneratedFileStream> ap(
      new cmGeneratedFileStream(this->MainImportFile, true));
    ap->SetCopyIfDifferent(true);
    foutPtr = std::move(ap);
  }
  if (!foutPtr || !*foutPtr) {
    std::string se = cmSystemTools::GetLastSystemError();
    std::ostringstream e;
    e << "cannot write to file \"" << this->MainImportFile << "\": " << se;
    cmSystemTools::Error(e.str());
    return false;
  }
  std::ostream& os = *foutPtr;
  std::stringstream mainFileWithHeadersAndFootersBuffer;

  // Start with the import file header.
  this->GenerateImportHeaderCode(mainFileWithHeadersAndFootersBuffer);

  // Create all the imported targets.
  std::stringstream mainFileBuffer;
  bool result = this->GenerateMainFile(mainFileBuffer);

  // Export find_dependency() calls. Must be done after GenerateMainFile(),
  // because that's when target dependencies are gathered, which we need for
  // the find_dependency() calls.
  if (!this->AppendMode && this->GetExportSet() &&
      this->ExportPackageDependencies) {
    this->SetRequiredCMakeVersion(3, 9, 0);
    this->GenerateFindDependencyCalls(mainFileWithHeadersAndFootersBuffer);
  }

  // Write cached import code.
  mainFileWithHeadersAndFootersBuffer << mainFileBuffer.rdbuf();

  // End with the import file footer.
  this->GenerateImportFooterCode(mainFileWithHeadersAndFootersBuffer);
  this->GeneratePolicyFooterCode(mainFileWithHeadersAndFootersBuffer);

  // This has to be done last, after the minimum CMake version has been
  // determined.
  this->GeneratePolicyHeaderCode(os);
  os << mainFileWithHeadersAndFootersBuffer.rdbuf();

  return result;
}